

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_52c65e::initiatorFixture::startLoggedOn(initiatorFixture *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int64_t iVar3;
  Message receivedLogon;
  Message sentLogon;
  Logon local_418;
  Message local_2c0 [8];
  undefined1 local_2b8 [336];
  Logon local_168;
  
  FIX::DateTime::nowUtc();
  local_418.super_Message._0_8_ = local_2b8._0_8_;
  local_418.super_Message._8_8_ = local_2b8._8_8_;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_date =
       local_2b8._0_8_;
  (this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_time = local_2b8._8_8_;
  uVar1 = *(undefined4 *)
           &(this->super_sessionFixture).super_TestCallback.now.super_DateTime.field_0xc;
  iVar3 = (this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_time;
  uVar2 = *(undefined4 *)
           ((long)&(this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_time + 4);
  (this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_date =
       (this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_date;
  *(undefined4 *)
   &(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.field_0xc = uVar1;
  *(int *)&(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time =
       (int)iVar3;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time + 4)
       = uVar2;
  (this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_date = 0x268636;
  (this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time =
       0x354649ac2000;
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.field_0xc
       = *(undefined8 *)
          &(this->super_sessionFixture).super_TestCallback.now.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_time + 4);
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.field_0xc =
       *(undefined8 *)
        &(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time +
        4);
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0,0x1f);
  createLogon(&local_418,"TW","ISLD",1);
  FIX::Message::Message(local_2c0,(Message *)&local_418);
  FIX::Message::~Message((Message *)&local_418);
  FIX::Session::send((Message *)(this->super_sessionFixture).object);
  FIX::Session::next((UtcTimeStamp *)(this->super_sessionFixture).object);
  FIX::Session::logon((this->super_sessionFixture).object);
  createLogon(&local_168,"ISLD","TW",1);
  FIX::Message::Message((Message *)&local_418,(Message *)&local_168);
  FIX::Message::~Message((Message *)&local_168);
  FIX::Session::next((Message *)(this->super_sessionFixture).object,(UtcTimeStamp *)&local_418,
                     (bool)((char)this + '\x10'));
  FIX::Message::~Message((Message *)&local_418);
  FIX::Message::~Message(local_2c0);
  return;
}

Assistant:

void startLoggedOn() {
    now = UtcTimeStamp::now();
    startTimeStamp = now;
    endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);

    createSession(1, 0, 31);

    FIX::Message sentLogon = createLogon("TW", "ISLD", 1);
    object->send(sentLogon);
    object->next(now);
    object->logon();

    FIX::Message receivedLogon = createLogon("ISLD", "TW", 1);
    object->next(receivedLogon, now);
  }